

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

VmConstant * CreateConstantFunction(Allocator *allocator,SynBase *source,VmFunction *function)

{
  VmType type;
  VmConstant *this;
  VmConstant *result;
  VmFunction *function_local;
  SynBase *source_local;
  Allocator *allocator_local;
  
  this = anon_unknown.dwarf_b60c8::get<VmConstant>(allocator);
  type.structType = VmType::Function.structType;
  type.type = VmType::Function.type;
  type.size = VmType::Function.size;
  VmConstant::VmConstant(this,allocator,type,source);
  this->fValue = function;
  return this;
}

Assistant:

VmConstant* CreateConstantFunction(Allocator *allocator, SynBase *source, VmFunction *function)
{
	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Function, source);

	result->fValue = function;

	return result;
}